

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O1

int Rml::Math::Log2(int value)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (1 < value) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 3 < (uint)value;
      value = (uint)value >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

RMLUICORE_API int Log2(int value)
	{
		int result = 0;
		while (value > 1)
		{
			value >>= 1;
			result++;
		}
		return result;
	}